

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall Graph::~Graph(Graph *this)

{
  Car *pCVar1;
  pointer pNVar2;
  void *pvVar3;
  long lVar4;
  
  this->_vptr_Graph = (_func_int **)&PTR__Graph_0010ad80;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"destructor!",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  if (this->nodes != (Node *)0x0) {
    operator_delete__(this->nodes);
  }
  this->nodes = (Node *)0x0;
  pCVar1 = this->cars;
  if (pCVar1 != (Car *)0x0) {
    pNVar2 = pCVar1[-1].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (pNVar2 != (pointer)0x0) {
      lVar4 = (long)pNVar2 * 0x30;
      do {
        pvVar3 = *(void **)((long)pCVar1 + lVar4 + -0x18);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar4 = lVar4 + -0x30;
      } while (lVar4 != 0);
    }
    operator_delete__(&pCVar1[-1].tour.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  this->cars = (Car *)0x0;
  if (0 < this->num_node) {
    lVar4 = 0;
    do {
      if (this->distance_matrix[lVar4] != (double *)0x0) {
        operator_delete__(this->distance_matrix[lVar4]);
      }
      this->distance_matrix[lVar4] = (double *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->num_node);
  }
  if (this->distance_matrix != (double **)0x0) {
    operator_delete__(this->distance_matrix);
  }
  this->distance_matrix = (double **)0x0;
  return;
}

Assistant:

Graph::~Graph()
{ 
	std::cout << "destructor!" << std::endl;
	delete[] nodes;
	nodes = nullptr;
	delete[] cars;
	cars = nullptr;
	for(int i = 0; i < num_node; i++){
		delete[] distance_matrix[i];
		distance_matrix[i] = nullptr;
	}
	delete[] distance_matrix;
	distance_matrix = nullptr;
}